

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O1

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Uint64(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,uint64_t u64)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *buffer;
  char *pcVar3;
  
  PrettyPrefix(this,kNumberType);
  buffer = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                     (&((this->
                        super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        ).os_)->stack_,0x14);
  pcVar3 = internal::u64toa(u64,buffer);
  pGVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).os_;
  pcVar2 = (pGVar1->stack_).stackTop_;
  if (((long)buffer - (long)pcVar3) + 0x14U <= (ulong)((long)pcVar2 - (long)(pGVar1->stack_).stack_)
     ) {
    (pGVar1->stack_).stackTop_ = pcVar2 + (-0x14 - ((long)buffer - (long)pcVar3));
    return true;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/stack.h"
                ,0x8b,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool Uint64(uint64_t u64)   { PrettyPrefix(kNumberType); return Base::EndValue(Base::WriteUint64(u64));  }